

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_socket.c
# Opt level: O1

ssize_t pcp_socket_recvfrom_impl
                  (int sock,void *buf,size_t len,int flags,sockaddr *src_addr,socklen_t *addrlen,
                  sockaddr_in6 *dst_addr)

{
  ulong uVar1;
  cmsghdr *__cmsg;
  int *piVar2;
  socklen_t sVar3;
  msghdr msg;
  char control_buf [1024];
  iovec local_488;
  msghdr local_478;
  cmsghdr local_438 [64];
  
  sVar3 = 0;
  memset(local_438,0,0x400);
  local_478.msg_flags = 0;
  local_478._52_4_ = 0;
  if (addrlen != (socklen_t *)0x0) {
    sVar3 = *addrlen;
  }
  local_478._12_4_ = 0;
  local_478.msg_namelen = sVar3;
  local_478.msg_iovlen = 1;
  local_478.msg_control = local_438;
  local_478.msg_controllen = 0x400;
  local_488.iov_base = buf;
  local_488.iov_len = len;
  local_478.msg_name = src_addr;
  local_478.msg_iov = &local_488;
  uVar1 = recvmsg(sock,&local_478,0);
  if ((0 < (long)uVar1) &&
     ((cmsghdr *)local_478.msg_control != (cmsghdr *)0x0 && 0xf < local_478.msg_controllen)) {
    __cmsg = (cmsghdr *)local_478.msg_control;
    do {
      if ((__cmsg->cmsg_level == 0) && (__cmsg->cmsg_type == 8)) {
        *(undefined8 *)&(dst_addr->sin6_addr).__in6_u = 0;
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[2] = 0xffff0000;
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[3] = __cmsg[1].cmsg_level;
        dst_addr->sin6_scope_id = 0;
        dst_addr->sin6_family = 10;
      }
      if ((__cmsg->cmsg_level == 0x29) && (__cmsg->cmsg_type == 0x32)) {
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[0] = (uint32_t)__cmsg[1].cmsg_len;
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[1] = *(uint32_t *)((long)&__cmsg[1].cmsg_len + 4);
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[2] = __cmsg[1].cmsg_level;
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[3] = __cmsg[1].cmsg_type;
        dst_addr->sin6_family = 10;
        if ((__cmsg[1].cmsg_len & 0xc0ff) == 0x80fe) {
          dst_addr->sin6_scope_id = (uint32_t)__cmsg[2].cmsg_len;
        }
        else {
          dst_addr->sin6_scope_id = 0;
        }
      }
      __cmsg = __cmsg_nxthdr(&local_478,__cmsg);
    } while (__cmsg != (cmsghdr *)0x0);
  }
  if (uVar1 == 0xffffffffffffffff) {
    piVar2 = __errno_location();
    uVar1 = (ulong)(*piVar2 != 0xb) << 3 | 0xfffffffffffffff3;
  }
  return uVar1;
}

Assistant:

static ssize_t pcp_socket_recvfrom_impl(PCP_SOCKET sock, void *buf, size_t len,
                                        int flags, struct sockaddr *src_addr,
                                        socklen_t *addrlen,
                                        struct sockaddr_in6 *dst_addr) {
    ssize_t ret = -1;

#ifndef PCP_SOCKET_IS_VOIDPTR
#if defined(IPV6_PKTINFO) && defined(IP_PKTINFO)
    char control_buf[1024] = {0};

#ifndef WIN32
    struct msghdr msg;
    struct iovec iov;
    struct cmsghdr *cmsg;

    iov.iov_base = buf;
    iov.iov_len = len;

    memset(&msg, 0, sizeof(msg));
    msg.msg_name = src_addr;
    msg.msg_namelen = addrlen ? *addrlen : 0;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;
    msg.msg_control = control_buf;
    msg.msg_controllen = sizeof(control_buf);

    // Receive message with IP_PKTINFO
    ret = recvmsg(sock, &msg, 0);

#else // WIN32
    WSAMSG msg;
    WSABUF iov;
    WSACMSGHDR *cmsg;
    iov.buf = buf;
    iov.len = len;

    memset(&msg, 0, sizeof(msg));
    msg.name = (struct sockaddr *)src_addr;
    msg.namelen = addrlen ? *addrlen : 0;
    msg.lpBuffers = &iov;
    msg.dwBufferCount = 1;
    msg.Control.buf = control_buf;
    msg.Control.len = sizeof(control_buf);
    msg.dwFlags = 0;
    // Get WSARecvMsg function pointer
    LPFN_WSARECVMSG WSARecvMsg;
    GUID guid = WSAID_WSARECVMSG;
    DWORD bytesReturned;
    if (WSAIoctl(sock, SIO_GET_EXTENSION_FUNCTION_POINTER, &guid, sizeof(guid),
                 &WSARecvMsg, sizeof(WSARecvMsg), &bytesReturned, NULL,
                 NULL) == SOCKET_ERROR) {
        perror("WSAIoctl failed");
        return 1;
    }

    DWORD bytesReceived;
    if (WSARecvMsg(sock, &msg, &bytesReceived, NULL, NULL) == SOCKET_ERROR) {
        ret = -1;
    } else {
#ifdef _WIN32
        if (bytesReceived > INT32_MAX) {
            ret = -1; // Handle overflow error
        } else {
            ret = (ssize_t)bytesReceived;
        }
#else
        ret = bytesReceived;
#endif
    }
#endif // WIN32

    // Processing control message
    if (ret > 0) {
        for (cmsg = CMSG_FIRSTHDR(&msg); cmsg != NULL;
             cmsg = CMSG_NXTHDR(&msg, cmsg)) {
            if (cmsg->cmsg_level == IPPROTO_IP &&
                cmsg->cmsg_type == IP_PKTINFO) {
                struct in_pktinfo *pktinfo =
                    (struct in_pktinfo *)PCP_CMSG_DATA(cmsg);
                S6_ADDR32(&dst_addr->sin6_addr)[0] = 0;
                S6_ADDR32(&dst_addr->sin6_addr)[1] = 0;
                S6_ADDR32(&dst_addr->sin6_addr)[2] = htonl(0xFFFF);
                S6_ADDR32(&dst_addr->sin6_addr)[3] = pktinfo->ipi_addr.s_addr;
                dst_addr->sin6_scope_id = 0;
                dst_addr->sin6_family = AF_INET6;
            }
            if (cmsg->cmsg_level == IPPROTO_IPV6 &&
                cmsg->cmsg_type == IPV6_PKTINFO) {
                struct in6_pktinfo *pktinfo6 =
                    (struct in6_pktinfo *)PCP_CMSG_DATA(cmsg);
                IPV6_ADDR_COPY(&dst_addr->sin6_addr, &pktinfo6->ipi6_addr);
                dst_addr->sin6_family = AF_INET6;
                if (IN6_IS_ADDR_LINKLOCAL(&pktinfo6->ipi6_addr)) {
                    dst_addr->sin6_scope_id = pktinfo6->ipi6_ifindex;
                } else {
                    dst_addr->sin6_scope_id = 0;
                }
            }
        }
    }
#else  // IPV6_PKTINFO && IP_PKTINFO
    ret = recvfrom(sock, buf, len, flags, src_addr, addrlen);
#endif // IPV6_PKTINFO && IP_PKTINFO
    if (ret == PCP_SOCKET_ERROR) {
        if (pcp_get_error() == PCP_ERR_WOULDBLOCK) {
            ret = PCP_ERR_WOULDBLOCK;
        } else {
            ret = PCP_ERR_RECV_FAILED;
        }
    }
#endif // PCP_SOCKET_IS_VOIDPTR

    return ret;
}